

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

ssize_t __thiscall LongReadsMapper::read(LongReadsMapper *this,int __fd,void *__buf,size_t __nbytes)

{
  ostream *poVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  char *pcVar3;
  ifstream *unaff_retaddr;
  bool in_stack_0000001b;
  LogLevels in_stack_0000001c;
  LongReadsMapper *in_stack_00000070;
  LongReadsMapper *v;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  v = this;
  poVar1 = sdglib::OutputLog(in_stack_0000001c,in_stack_0000001b);
  poVar1 = std::operator<<(poVar1,"Reading long read mappings");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::read(pcVar3,(long)&this->k);
  std::istream::read(pcVar3,(long)&this->max_index_freq);
  std::istream::read(pcVar3,(long)&this->min_size);
  std::istream::read(pcVar3,(long)&this->min_chain);
  std::istream::read(pcVar3,(long)&this->max_jump);
  std::istream::read(pcVar3,(long)&this->max_delta_change);
  sdglib::read_flat_vector<LongReadMapping>
            (unaff_retaddr,(vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)v);
  poVar1 = sdglib::OutputLog(in_stack_0000001c,in_stack_0000001b);
  poVar1 = std::operator<<(poVar1,"Updating read mapping indexes!");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  update_indexes(in_stack_00000070);
  poVar1 = sdglib::OutputLog(in_stack_0000001c,in_stack_0000001b);
  poVar1 = std::operator<<(poVar1,"Done!");
  sVar2 = std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return sVar2;
}

Assistant:

void LongReadsMapper::read(std::ifstream &inf) {
    sdglib::OutputLog() << "Reading long read mappings" << std::endl;

    inf.read(reinterpret_cast<char *>(&k), sizeof(k));
    inf.read(reinterpret_cast<char *>(&max_index_freq), sizeof(max_index_freq));
    inf.read(reinterpret_cast<char *>(&min_size), sizeof(min_size));
    inf.read(reinterpret_cast<char *>(&min_chain), sizeof(min_chain));
    inf.read(reinterpret_cast<char *>(&max_jump), sizeof(max_jump));
    inf.read(reinterpret_cast<char *>(&max_delta_change), sizeof(max_delta_change));

    sdglib::read_flat_vector(inf, mappings);

    sdglib::OutputLog() << "Updating read mapping indexes!" << std::endl;
    update_indexes();
    sdglib::OutputLog() << "Done!" << std::endl;
}